

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O1

int64_t av1_lowbd_pixel_proj_error_avx2
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  
  iVar8 = params->r[0];
  if (iVar8 < 1) {
LAB_0048af5c:
    if (params->r[1] < 1) {
      iVar8 = 0;
      if (height < 1) {
        auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        lVar5 = 0;
      }
      else {
        auVar11 = ZEXT1664((undefined1  [16])0x0);
        lVar5 = 0;
        do {
          uVar10 = 0;
          if (0xf < width) {
            lVar6 = 0;
            do {
              auVar17 = vpmovzxbw_avx2(*(undefined1 (*) [16])(dat8 + lVar6));
              auVar13 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src8 + lVar6));
              auVar17 = vpsubw_avx2(auVar17,auVar13);
              auVar17 = vpmaddwd_avx2(auVar17,auVar17);
              auVar17 = vpaddd_avx2(auVar17,auVar11._0_32_);
              auVar11 = ZEXT3264(auVar17);
              lVar6 = lVar6 + 0x10;
              uVar10 = (width - 0x10U & 0xfffffff0) + 0x10;
            } while (lVar6 <= (int)(width - 0x10U));
          }
          auVar17 = auVar11._0_32_;
          if ((int)uVar10 < width) {
            uVar7 = (ulong)uVar10;
            do {
              lVar5 = lVar5 + ((ulong)dat8[uVar7] - (ulong)src8[uVar7]) *
                              ((ulong)dat8[uVar7] - (ulong)src8[uVar7]);
              uVar7 = uVar7 + 1;
            } while ((int)uVar7 < width);
          }
          dat8 = dat8 + dat_stride;
          src8 = src8 + src_stride;
          iVar8 = iVar8 + 1;
        } while (iVar8 != height);
      }
      auVar13 = vpmovsxdq_avx2(auVar17._0_16_);
      auVar17 = vpmovsxdq_avx2(auVar17._16_16_);
      auVar17 = vpaddq_avx2(auVar13,auVar17);
      goto LAB_0048b166;
    }
LAB_0048af67:
    iVar9 = 0;
    if (0 < height) {
      if (0 < iVar8) {
        flt1 = flt0;
        flt1_stride = flt0_stride;
      }
      uVar10 = xq[iVar8 < 1];
      iVar8 = (uVar10 & 0xffff) + uVar10 * -0x100000;
      auVar13._4_4_ = iVar8;
      auVar13._0_4_ = iVar8;
      auVar13._8_4_ = iVar8;
      auVar13._12_4_ = iVar8;
      auVar13._16_4_ = iVar8;
      auVar13._20_4_ = iVar8;
      auVar13._24_4_ = iVar8;
      auVar13._28_4_ = iVar8;
      auVar11 = ZEXT1664((undefined1  [16])0x0);
      auVar15._8_4_ = 0x400;
      auVar15._0_8_ = 0x40000000400;
      auVar15._12_4_ = 0x400;
      auVar15._16_4_ = 0x400;
      auVar15._20_4_ = 0x400;
      auVar15._24_4_ = 0x400;
      auVar15._28_4_ = 0x400;
      lVar5 = 0;
      do {
        uVar7 = 0;
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        auVar17 = auVar16._0_32_;
        if (0xf < width) {
          lVar6 = 0;
          do {
            auVar14 = vpmovzxbw_avx2(*(undefined1 (*) [16])(dat8 + lVar6));
            auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src8 + lVar6));
            auVar17 = vpackssdw_avx2(*(undefined1 (*) [32])(flt1 + lVar6),
                                     *(undefined1 (*) [32])(flt1 + lVar6 + 8));
            auVar12 = vpermq_avx2(auVar17,0xd8);
            auVar17 = vpunpcklwd_avx2(auVar12,auVar14);
            auVar17 = vpmaddwd_avx2(auVar13,auVar17);
            auVar12 = vpunpckhwd_avx2(auVar12,auVar14);
            auVar12 = vpmaddwd_avx2(auVar13,auVar12);
            auVar17 = vpaddd_avx2(auVar17,auVar15);
            auVar18 = vpsrad_avx2(auVar17,0xb);
            auVar17 = vpaddd_avx2(auVar12,auVar15);
            auVar17 = vpsrad_avx2(auVar17,0xb);
            auVar17 = vpackssdw_avx2(auVar18,auVar17);
            auVar12 = vpsubw_avx2(auVar14,auVar4);
            auVar17 = vpaddw_avx2(auVar12,auVar17);
            auVar17 = vpmaddwd_avx2(auVar17,auVar17);
            auVar17 = vpaddd_avx2(auVar17,auVar16._0_32_);
            auVar16 = ZEXT3264(auVar17);
            lVar6 = lVar6 + 0x10;
          } while (lVar6 <= (int)(width - 0x10U));
          uVar7 = (ulong)((width - 0x10U & 0xfffffff0) + 0x10);
        }
        iVar8 = (int)uVar7;
        while (iVar8 < width) {
          lVar6 = (long)(int)(((uint)dat8[uVar7] - (uint)src8[uVar7]) +
                             ((int)((flt1[uVar7] + (uint)dat8[uVar7] * -0x10) * uVar10 + 0x400) >>
                             0xb));
          lVar5 = lVar5 + lVar6 * lVar6;
          uVar7 = uVar7 + 1;
          iVar8 = (int)uVar7;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        auVar12 = vpmovsxdq_avx2(auVar17._0_16_);
        auVar12 = vpaddq_avx2(auVar11._0_32_,auVar12);
        auVar17 = vpmovsxdq_avx2(auVar17._16_16_);
        auVar17 = vpaddq_avx2(auVar12,auVar17);
        auVar11 = ZEXT3264(auVar17);
        iVar9 = iVar9 + 1;
        flt1 = flt1 + flt1_stride;
      } while (iVar9 != height);
      goto LAB_0048b166;
    }
  }
  else {
    if (params->r[1] < 1) {
      if (iVar8 < 1) goto LAB_0048af5c;
      goto LAB_0048af67;
    }
    iVar8 = 0;
    if (0 < height) {
      uVar10 = *xq & 0xffffU | xq[1] << 0x10;
      auVar12._4_4_ = uVar10;
      auVar12._0_4_ = uVar10;
      auVar12._8_4_ = uVar10;
      auVar12._12_4_ = uVar10;
      auVar12._16_4_ = uVar10;
      auVar12._20_4_ = uVar10;
      auVar12._24_4_ = uVar10;
      auVar12._28_4_ = uVar10;
      auVar11 = ZEXT1664((undefined1  [16])0x0);
      auVar14._8_4_ = 0x400;
      auVar14._0_8_ = 0x40000000400;
      auVar14._12_4_ = 0x400;
      auVar14._16_4_ = 0x400;
      auVar14._20_4_ = 0x400;
      auVar14._24_4_ = 0x400;
      auVar14._28_4_ = 0x400;
      lVar5 = 0;
      do {
        uVar7 = 0;
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        auVar17 = auVar16._0_32_;
        if (0xf < width) {
          lVar6 = 0;
          do {
            auVar15 = vpmovzxbw_avx2(*(undefined1 (*) [16])(dat8 + lVar6));
            auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src8 + lVar6));
            auVar17 = vpackssdw_avx2(*(undefined1 (*) [32])(flt0 + lVar6),
                                     *(undefined1 (*) [32])(flt0 + lVar6 + 8));
            auVar13 = vpackssdw_avx2(*(undefined1 (*) [32])(flt1 + lVar6),
                                     *(undefined1 (*) [32])(flt1 + lVar6 + 8));
            auVar19 = vpsllw_avx2(auVar15,4);
            auVar17 = vpermq_avx2(auVar17,0xd8);
            auVar18 = vpsubw_avx2(auVar17,auVar19);
            auVar17 = vpermq_avx2(auVar13,0xd8);
            auVar13 = vpsubw_avx2(auVar17,auVar19);
            auVar17 = vpunpcklwd_avx2(auVar18,auVar13);
            auVar17 = vpmaddwd_avx2(auVar17,auVar12);
            auVar13 = vpunpckhwd_avx2(auVar18,auVar13);
            auVar13 = vpmaddwd_avx2(auVar12,auVar13);
            auVar17 = vpaddd_avx2(auVar17,auVar14);
            auVar18 = vpsrad_avx2(auVar17,0xb);
            auVar17 = vpaddd_avx2(auVar13,auVar14);
            auVar17 = vpsrad_avx2(auVar17,0xb);
            auVar17 = vpackssdw_avx2(auVar18,auVar17);
            auVar13 = vpsubw_avx2(auVar15,auVar4);
            auVar17 = vpaddw_avx2(auVar13,auVar17);
            auVar17 = vpmaddwd_avx2(auVar17,auVar17);
            auVar17 = vpaddd_avx2(auVar17,auVar16._0_32_);
            auVar16 = ZEXT3264(auVar17);
            lVar6 = lVar6 + 0x10;
          } while (lVar6 <= (int)(width - 0x10U));
          uVar7 = (ulong)((width - 0x10U & 0xfffffff0) + 0x10);
        }
        iVar9 = (int)uVar7;
        while (iVar9 < width) {
          bVar1 = dat8[uVar7];
          lVar6 = (long)(int)(((uint)bVar1 - (uint)src8[uVar7]) +
                             ((int)((flt0[uVar7] + (uint)bVar1 * -0x10) * *xq +
                                    (flt1[uVar7] + (uint)bVar1 * -0x10) * xq[1] + 0x400) >> 0xb));
          lVar5 = lVar5 + lVar6 * lVar6;
          uVar7 = uVar7 + 1;
          iVar9 = (int)uVar7;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        auVar13 = vpmovsxdq_avx2(auVar17._0_16_);
        auVar13 = vpaddq_avx2(auVar11._0_32_,auVar13);
        auVar17 = vpmovsxdq_avx2(auVar17._16_16_);
        auVar17 = vpaddq_avx2(auVar13,auVar17);
        auVar11 = ZEXT3264(auVar17);
        iVar8 = iVar8 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
      } while (iVar8 != height);
      goto LAB_0048b166;
    }
  }
  auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  lVar5 = 0;
LAB_0048b166:
  auVar2 = vpaddq_avx(auVar17._0_16_,auVar17._16_16_);
  auVar3 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar3);
  return auVar2._0_8_ + lVar5;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_avx2(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m256i rounding = _mm256_set1_epi32(1 << (shift - 1));
  __m256i sum64 = _mm256_setzero_si256();
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    __m256i xq_coeff = pair_set_epi16(xq[0], xq[1]);
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i flt0_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt0 + j),
                               yy_loadu_256(flt0 + j + 8)),
            0xd8);
        const __m256i flt1_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt1 + j),
                               yy_loadu_256(flt1 + j + 8)),
            0xd8);
        const __m256i u0 = _mm256_slli_epi16(d0, SGRPROJ_RST_BITS);
        const __m256i flt0_0_sub_u = _mm256_sub_epi16(flt0_16b, u0);
        const __m256i flt1_0_sub_u = _mm256_sub_epi16(flt1_16b, u0);
        const __m256i v0 = _mm256_madd_epi16(
            xq_coeff, _mm256_unpacklo_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m256i v1 = _mm256_madd_epi16(
            xq_coeff, _mm256_unpackhi_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m256i vr0 =
            _mm256_srai_epi32(_mm256_add_epi32(v0, rounding), shift);
        const __m256i vr1 =
            _mm256_srai_epi32(_mm256_add_epi32(v1, rounding), shift);
        const __m256i e0 = _mm256_sub_epi16(
            _mm256_add_epi16(_mm256_packs_epi32(vr0, vr1), d0), s0);
        const __m256i err0 = _mm256_madd_epi16(e0, e0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      const __m256i sum64_0 =
          _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
      const __m256i sum64_1 =
          _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum64_0);
      sum64 = _mm256_add_epi64(sum64, sum64_1);
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    const int xq_active = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m256i xq_coeff =
        pair_set_epi16(xq_active, -xq_active * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i flt_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt + j),
                               yy_loadu_256(flt + j + 8)),
            0xd8);
        const __m256i v0 =
            _mm256_madd_epi16(xq_coeff, _mm256_unpacklo_epi16(flt_16b, d0));
        const __m256i v1 =
            _mm256_madd_epi16(xq_coeff, _mm256_unpackhi_epi16(flt_16b, d0));
        const __m256i vr0 =
            _mm256_srai_epi32(_mm256_add_epi32(v0, rounding), shift);
        const __m256i vr1 =
            _mm256_srai_epi32(_mm256_add_epi32(v1, rounding), shift);
        const __m256i e0 = _mm256_sub_epi16(
            _mm256_add_epi16(_mm256_packs_epi32(vr0, vr1), d0), s0);
        const __m256i err0 = _mm256_madd_epi16(e0, e0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_active * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
      const __m256i sum64_0 =
          _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
      const __m256i sum64_1 =
          _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum64_0);
      sum64 = _mm256_add_epi64(sum64, sum64_1);
    }
  } else {
    __m256i sum32 = _mm256_setzero_si256();
    for (i = 0; i < height; ++i) {
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i diff0 = _mm256_sub_epi16(d0, s0);
        const __m256i err0 = _mm256_madd_epi16(diff0, diff0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
    const __m256i sum64_0 =
        _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
    const __m256i sum64_1 =
        _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
    sum64 = _mm256_add_epi64(sum64_0, sum64_1);
  }
  int64_t sum[4];
  yy_storeu_256(sum, sum64);
  err += sum[0] + sum[1] + sum[2] + sum[3];
  return err;
}